

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.cpp
# Opt level: O0

int musl_getopt_long_only(int argc,char **argv,char *optstring,option *longopts,int *idx)

{
  int iVar1;
  int *idx_local;
  option *longopts_local;
  char *optstring_local;
  char **argv_local;
  int argc_local;
  
  iVar1 = musl_getopt_long(argc,argv,optstring,longopts,idx,1);
  return iVar1;
}

Assistant:

int musl_getopt_long_only(int argc, char **argv, char const *optstring,
			  const struct option *longopts, int *idx)
{
	return musl_getopt_long(argc, argv, optstring, longopts, idx, 1);
}